

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O3

void __thiscall
aggreports::SampleMeanWithWeighting
          (aggreports *this,vector<int,_std::allocator<int>_> *fileIDs,
          offset_in_OutLosses_to_subr GetOutLoss,int epcalc,int eptype,int eptype_tvar)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  double dVar3;
  int iVar4;
  pointer pmVar5;
  iterator iVar6;
  undefined4 uVar7;
  mapped_type *pmVar8;
  _Base_ptr p_Var9;
  vector<lossval,std::allocator<lossval>> *pvVar10;
  long *plVar11;
  code *pcVar12;
  _Base_ptr p_Var13;
  _Rb_tree_node_base *p_Var14;
  undefined4 in_register_0000000c;
  _Base_ptr p_Var15;
  _Base_ptr p_Var16;
  _Base_ptr p_Var17;
  _Base_ptr p_Var18;
  float fVar19;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_double>_>,_std::_Rb_tree_iterator<std::pair<const_int,_double>_>_>
  pVar20;
  int in_stack_00000008;
  summary_id_period_key sk_1;
  summary_id_period_key sk;
  _Base_ptr p_Stack_130;
  _Base_ptr local_128;
  _Base_ptr p_Stack_120;
  _Base_ptr local_110;
  pair<const_outkey2,_OutLosses> x_1;
  undefined4 uStack_f4;
  map<summary_id_period_key,_lossval,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_lossval>_>_>
  items;
  map<int,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
  mean_map;
  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  unusedperiodstoweighting;
  
  if (this->samplesize_ != 0) {
    local_110 = (_Base_ptr)CONCAT44(local_110._4_4_,eptype_tvar);
    items._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &items._M_t._M_impl.super__Rb_tree_header._M_header;
    items._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    items._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    items._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    items._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         items._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::
    _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
    ::_Rb_tree(&unusedperiodstoweighting._M_t,&(this->periodstoweighting_)._M_t);
    pmVar5 = (this->out_loss_->
             super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    p_Var9 = *(_Base_ptr *)((long)&pmVar5[1]._M_t._M_impl.super__Rb_tree_header + 0x10);
    p_Var13 = &pmVar5[1]._M_t._M_impl.super__Rb_tree_header._M_header;
    if (p_Var9 != p_Var13) {
      p_Var1 = &(this->periodstoweighting_)._M_t._M_impl.super__Rb_tree_header;
      plVar11 = (long *)(&mean_map._M_t._M_impl.super__Rb_tree_header._M_header.field_0x4 +
                        CONCAT44(in_register_0000000c,epcalc));
      do {
        mean_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)
             CONCAT44(mean_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_,
                      *(undefined4 *)&p_Var9[1]._M_left);
        sk.summary_id = p_Var9[1]._M_color;
        sk.period_no = *(int *)&p_Var9[1].field_0x4;
        mean_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = p_Var9[1]._M_parent;
        p_Var17 = (this->periodstoweighting_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
        ;
        p_Var15 = &p_Var1->_M_header;
        mean_map._M_t._M_impl._0_8_ = sk;
        if (p_Var17 != (_Base_ptr)0x0) {
          do {
            if (sk.period_no <= (int)*(size_t *)(p_Var17 + 1)) {
              p_Var15 = p_Var17;
            }
            p_Var17 = (&p_Var17->_M_left)[(int)*(size_t *)(p_Var17 + 1) < sk.period_no];
          } while (p_Var17 != (_Base_ptr)0x0);
          if (((_Rb_tree_header *)p_Var15 != p_Var1) &&
             ((int)((_Rb_tree_header *)p_Var15)->_M_node_count <= sk.period_no)) {
            dVar3 = *(double *)((long)p_Var15 + 0x28);
            pmVar8 = std::
                     map<summary_id_period_key,_lossval,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_lossval>_>_>
                     ::operator[](&items,&sk);
            pmVar8->period_weighting = dVar3;
            uVar7 = mean_map._M_t._M_impl._4_4_;
            pmVar8 = std::
                     map<summary_id_period_key,_lossval,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_lossval>_>_>
                     ::operator[](&items,&sk);
            pmVar8->period_no = uVar7;
            pcVar12 = (code *)GetOutLoss;
            if ((GetOutLoss & 1) != 0) {
              pcVar12 = *(code **)(*plVar11 + -1 + GetOutLoss);
            }
            fVar19 = (float)(*pcVar12)(plVar11);
            iVar4 = this->samplesize_;
            pmVar8 = std::
                     map<summary_id_period_key,_lossval,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_lossval>_>_>
                     ::operator[](&items,&sk);
            pmVar8->value = fVar19 / (float)iVar4 + pmVar8->value;
          }
        }
        pVar20 = std::
                 _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                 ::equal_range(&unusedperiodstoweighting._M_t,
                               (key_type *)&mean_map._M_t._M_impl.field_0x4);
        std::
        _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
        ::_M_erase_aux(&unusedperiodstoweighting._M_t,(_Base_ptr)pVar20.first._M_node,
                       (_Base_ptr)pVar20.second._M_node);
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
      } while (p_Var9 != p_Var13);
    }
    mean_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &mean_map._M_t._M_impl.super__Rb_tree_header._M_header;
    mean_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         mean_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
    mean_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    mean_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    mean_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         mean_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)items._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
        &items._M_t._M_impl.super__Rb_tree_header) {
      p_Var9 = items._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        sk.summary_id = p_Var9[1]._M_color;
        sk.period_no = *(int *)&p_Var9[1].field_0x4;
        p_Stack_130 = p_Var9[1]._M_parent;
        local_128 = p_Var9[1]._M_left;
        p_Stack_120 = p_Var9[1]._M_right;
        pvVar10 = (vector<lossval,std::allocator<lossval>> *)
                  std::
                  map<int,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
                  ::operator[](&mean_map,&sk.summary_id);
        iVar6._M_current = *(lossval **)(pvVar10 + 8);
        if (iVar6._M_current == *(lossval **)(pvVar10 + 0x10)) {
          std::vector<lossval,std::allocator<lossval>>::_M_realloc_insert<lossval_const&>
                    (pvVar10,iVar6,(lossval *)&p_Stack_130);
        }
        else {
          *(_Base_ptr *)&(iVar6._M_current)->value = p_Stack_120;
          *(_Base_ptr *)iVar6._M_current = p_Stack_130;
          (iVar6._M_current)->period_weighting = (double)local_128;
          *(long *)(pvVar10 + 8) = *(long *)(pvVar10 + 8) + 0x18;
        }
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
      } while ((_Rb_tree_header *)p_Var9 != &items._M_t._M_impl.super__Rb_tree_header);
    }
    WriteExceedanceProbabilityTable
              (this,fileIDs,&mean_map,(float)this->samplesize_,eptype,(int)local_110,
               in_stack_00000008,&unusedperiodstoweighting,1);
    if ((this->ordFlag_ == false) &&
       ((this->ensembletosidx_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
      p_Var9 = (this->ensembletosidx_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var1 = &(this->ensembletosidx_)._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var9 != p_Var1) {
        p_Var2 = &(this->periodstoweighting_)._M_t._M_impl.super__Rb_tree_header;
        plVar11 = (long *)((long)&x_1.second.agg_out_loss + CONCAT44(in_register_0000000c,epcalc));
        do {
          sk.summary_id = p_Var9[1]._M_color;
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)&p_Stack_130,
                     (vector<int,_std::allocator<int>_> *)&p_Var9[1]._M_parent);
          std::
          _Rb_tree<summary_id_period_key,_std::pair<const_summary_id_period_key,_lossval>,_std::_Select1st<std::pair<const_summary_id_period_key,_lossval>_>,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_lossval>_>_>
          ::clear(&items._M_t);
          std::
          _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
          ::operator=(&unusedperiodstoweighting._M_t,&(this->periodstoweighting_)._M_t);
          pmVar5 = (this->out_loss_->
                   super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          p_Var13 = *(_Base_ptr *)((long)&pmVar5[1]._M_t._M_impl.super__Rb_tree_header + 0x10);
          local_110 = &pmVar5[1]._M_t._M_impl.super__Rb_tree_header._M_header;
          if (p_Var13 != local_110) {
            do {
              p_Var17 = local_128;
              stack0xffffffffffffff08 =
                   (_Base_ptr)CONCAT44(uStack_f4,*(undefined4 *)&p_Var13[1]._M_left);
              x_1.first.summary_id = p_Var13[1]._M_color;
              x_1.first.period_no = *(int *)&p_Var13[1].field_0x4;
              x_1._8_8_ = p_Var13[1]._M_parent;
              for (p_Var15 = p_Stack_130; p_Var15 != p_Var17;
                  p_Var15 = (_Base_ptr)&p_Var15->field_0x4) {
                if (x_1.first.sidx == p_Var15->_M_color) {
                  sk_1.summary_id = x_1.first.summary_id;
                  sk_1.period_no = x_1.first.period_no;
                  p_Var18 = (this->periodstoweighting_)._M_t._M_impl.super__Rb_tree_header._M_header
                            ._M_parent;
                  p_Var16 = &p_Var2->_M_header;
                  if (p_Var18 != (_Base_ptr)0x0) {
                    do {
                      if (x_1.first.period_no <= (int)*(size_t *)(p_Var18 + 1)) {
                        p_Var16 = p_Var18;
                      }
                      p_Var18 = (&p_Var18->_M_left)
                                [(int)*(size_t *)(p_Var18 + 1) < x_1.first.period_no];
                    } while (p_Var18 != (_Base_ptr)0x0);
                    if (((_Rb_tree_header *)p_Var16 != p_Var2) &&
                       ((int)((_Rb_tree_header *)p_Var16)->_M_node_count <= x_1.first.period_no)) {
                      dVar3 = *(double *)((long)p_Var16 + 0x28);
                      pmVar8 = std::
                               map<summary_id_period_key,_lossval,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_lossval>_>_>
                               ::operator[](&items,&sk_1);
                      pmVar8->period_weighting = dVar3;
                      iVar4 = x_1.first.period_no;
                      pmVar8 = std::
                               map<summary_id_period_key,_lossval,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_lossval>_>_>
                               ::operator[](&items,&sk_1);
                      pmVar8->period_no = iVar4;
                      pcVar12 = (code *)GetOutLoss;
                      if ((GetOutLoss & 1) != 0) {
                        pcVar12 = *(code **)(*plVar11 + -1 + GetOutLoss);
                      }
                      fVar19 = (float)(*pcVar12)(plVar11);
                      p_Var16 = local_128;
                      p_Var18 = p_Stack_130;
                      pmVar8 = std::
                               map<summary_id_period_key,_lossval,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_lossval>_>_>
                               ::operator[](&items,&sk_1);
                      pmVar8->value =
                           fVar19 / (float)(ulong)((long)p_Var16 - (long)p_Var18 >> 2) +
                           pmVar8->value;
                    }
                  }
                  pVar20 = std::
                           _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                           ::equal_range(&unusedperiodstoweighting._M_t,&x_1.first.period_no);
                  std::
                  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                  ::_M_erase_aux(&unusedperiodstoweighting._M_t,(_Base_ptr)pVar20.first._M_node,
                                 (_Base_ptr)pVar20.second._M_node);
                }
              }
              p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13);
            } while (p_Var13 != local_110);
          }
          std::
          _Rb_tree<int,_std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
          ::clear(&mean_map._M_t);
          for (p_Var14 = items._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var14 != &items._M_t._M_impl.super__Rb_tree_header;
              p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14)) {
            x_1.first.summary_id = p_Var14[1]._M_color;
            x_1.first.period_no = *(int *)&p_Var14[1].field_0x4;
            x_1._8_8_ = p_Var14[1]._M_parent;
            unique0x100005d1 = p_Var14[1]._M_left;
            p_Var13 = p_Var14[1]._M_right;
            pvVar10 = (vector<lossval,std::allocator<lossval>> *)
                      std::
                      map<int,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
                      ::operator[]((map<int,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
                                    *)&mean_map._M_t,(key_type *)&x_1);
            iVar6._M_current = *(lossval **)(pvVar10 + 8);
            if (iVar6._M_current == *(lossval **)(pvVar10 + 0x10)) {
              std::vector<lossval,std::allocator<lossval>>::_M_realloc_insert<lossval_const&>
                        (pvVar10,iVar6,(lossval *)&x_1.first.sidx);
            }
            else {
              *(_Base_ptr *)&(iVar6._M_current)->value = p_Var13;
              (iVar6._M_current)->period_no = x_1.first.sidx;
              *(OASIS_FLOAT *)&(iVar6._M_current)->field_0x4 = x_1.second.agg_out_loss;
              (iVar6._M_current)->period_weighting = (double)stack0xffffffffffffff08;
              *(long *)(pvVar10 + 8) = *(long *)(pvVar10 + 8) + 0x18;
            }
          }
          WriteExceedanceProbabilityTable
                    (this,fileIDs,
                     (map<int,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
                      *)&mean_map._M_t,(float)this->samplesize_,eptype,sk.summary_id,
                     in_stack_00000008,&unusedperiodstoweighting,1);
          if (p_Stack_130 != (_Base_ptr)0x0) {
            operator_delete(p_Stack_130);
          }
          p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
        } while ((_Rb_tree_header *)p_Var9 != p_Var1);
      }
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
    ::~_Rb_tree(&mean_map._M_t);
    std::
    _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
    ::~_Rb_tree(&unusedperiodstoweighting._M_t);
    std::
    _Rb_tree<summary_id_period_key,_std::pair<const_summary_id_period_key,_lossval>,_std::_Select1st<std::pair<const_summary_id_period_key,_lossval>_>,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_lossval>_>_>
    ::~_Rb_tree(&items._M_t);
  }
  return;
}

Assistant:

void aggreports::SampleMeanWithWeighting(const std::vector<int> &fileIDs,
	OASIS_FLOAT (OutLosses::*GetOutLoss)(), const int epcalc,
	const int eptype, const int eptype_tvar) {

  if (samplesize_ == 0) return;   // Prevent division by zero error

  std::map<summary_id_period_key, lossval> items;
  std::map<int, double> unusedperiodstoweighting = periodstoweighting_;

  for (auto x : (*out_loss_)[SAMPLES]) {
    summary_id_period_key sk;
    sk.summary_id = x.first.summary_id;
    sk.period_no = x.first.period_no;
    auto iter = periodstoweighting_.find(x.first.period_no);
    if (iter != periodstoweighting_.end()) {
      items[sk].period_weighting = iter->second;
      items[sk].period_no = x.first.period_no;   // for debugging
      items[sk].value += ((x.second.*GetOutLoss)() / samplesize_);
    }
    unusedperiodstoweighting.erase(x.first.period_no);
  }

  std::map<int, lossvec2> mean_map;
  for (auto s : items) {
    mean_map[s.first.summary_id].push_back(s.second);
  }

  WriteExceedanceProbabilityTable(fileIDs, mean_map, samplesize_, epcalc,
				  eptype, eptype_tvar,
				  unusedperiodstoweighting);

  // By ensemble ID
  if (ordFlag_) return;   // Ensemble IDs not supported for ORD output
  if (ensembletosidx_.size() > 0) {
    for (auto ensemble : ensembletosidx_) {
      items.clear();
      unusedperiodstoweighting = periodstoweighting_;
      for (auto x : (*out_loss_)[SAMPLES]) {
	for (auto sidx : ensemble.second) {
	  if (x.first.sidx == sidx) {
	    summary_id_period_key sk;
	    sk.summary_id = x.first.summary_id;
	    sk.period_no = x.first.period_no;
	    auto iter = periodstoweighting_.find(x.first.period_no);
	    if (iter != periodstoweighting_.end()) {
	      items[sk].period_weighting = iter->second;
	      items[sk].period_no = x.first.period_no;   // for debugging
	      items[sk].value += ((x.second.*GetOutLoss)() / ensemble.second.size());
	    }
	    unusedperiodstoweighting.erase(x.first.period_no);
	  }
	}
      }
      mean_map.clear();
      for (auto s : items) {
	mean_map[s.first.summary_id].push_back(s.second);
      }
      WriteExceedanceProbabilityTable(fileIDs, mean_map, samplesize_,
				      epcalc, ensemble.first, eptype_tvar,
				      unusedperiodstoweighting, 1);
    }
  }
}